

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O0

UBool uset_containsAllCodePoints_63(USet *set,UChar *str,int32_t strLen)

{
  UBool UVar1;
  ConstChar16Ptr local_68;
  undefined1 local_60 [8];
  UnicodeString s;
  int32_t strLen_local;
  UChar *str_local;
  USet *set_local;
  
  s.fUnion._52_4_ = strLen;
  icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_68,str);
  icu_63::UnicodeString::UnicodeString
            ((UnicodeString *)local_60,strLen == -1,&local_68,s.fUnion._52_4_);
  icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  UVar1 = icu_63::UnicodeSet::containsAll((UnicodeSet *)set,(UnicodeString *)local_60);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_60);
  return UVar1;
}

Assistant:

U_CAPI UBool U_EXPORT2
uset_containsAllCodePoints(const USet* set, const UChar *str, int32_t strLen) {
    // Create a string alias, since nothing is being added to the set.
    UnicodeString s(strLen==-1, str, strLen);
    return ((const UnicodeSet*) set)->UnicodeSet::containsAll(s);
}